

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  _Rb_tree_color _Var4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  long *plVar7;
  Type *descriptor;
  long *plVar8;
  size_type *psVar9;
  _Base_ptr p_Var10;
  uint index;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  long lVar13;
  string error;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  key_type local_f4;
  EnumDescriptorProto *local_f0;
  string local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  DescriptorBuilder *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  index = 0;
  local_a8 = this;
  if (0 < *(int *)(enm + 4)) {
    do {
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                (&(proto->value_).super_RepeatedPtrFieldBase,index);
      index = index + 1;
    } while ((int)index < *(int *)(enm + 4));
    index = (uint)(0 < *(int *)(enm + 4));
  }
  if (((*(byte *)(*(long *)(enm + 0x20) + 0x28) & 1) == 0) ||
     (*(char *)(*(long *)(enm + 0x20) + 0x48) == '\0')) {
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f0 = proto;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    if ((char)index != '\0') {
      local_f0 = (EnumDescriptorProto *)&proto->value_;
      lVar13 = 0;
      do {
        lVar1 = *(long *)(enm + 0x28) + lVar13 * 0x20;
        iVar3 = *(int *)(*(long *)(enm + 0x28) + 4 + lVar13 * 0x20);
        p_Var12 = &p_Var2->_M_header;
        p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0035c66e:
          local_e8._M_dataplus._M_p._0_4_ = iVar3;
          pmVar6 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,(key_type *)&local_e8);
          std::__cxx11::string::_M_assign((string *)pmVar6);
        }
        else {
          do {
            p_Var10 = p_Var5;
            p_Var11 = p_Var12;
            _Var4 = p_Var10[1]._M_color;
            p_Var12 = p_Var10;
            if ((int)_Var4 < iVar3) {
              p_Var12 = p_Var11;
            }
            p_Var5 = (&p_Var10->_M_left)[(int)_Var4 < iVar3];
          } while ((&p_Var10->_M_left)[(int)_Var4 < iVar3] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var12 == p_Var2) goto LAB_0035c66e;
          if ((int)_Var4 < iVar3) {
            p_Var10 = p_Var11;
          }
          if (iVar3 < (int)p_Var10[1]._M_color) goto LAB_0035c66e;
          std::operator+(&local_80,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(lVar1 + 8) + 0x20));
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
          plVar8 = plVar7 + 2;
          if ((long *)*plVar7 == plVar8) {
            local_90 = *plVar8;
            lStack_88 = plVar7[3];
            local_a0 = &local_90;
          }
          else {
            local_90 = *plVar8;
            local_a0 = (long *)*plVar7;
          }
          local_98 = plVar7[1];
          *plVar7 = (long)plVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_f4 = *(key_type *)(lVar1 + 4);
          pmVar6 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_f4);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_a0,(ulong)(pmVar6->_M_dataplus)._M_p);
          local_c8 = &local_b8;
          plVar8 = plVar7 + 2;
          if ((long *)*plVar7 == plVar8) {
            local_b8 = *plVar8;
            lStack_b0 = plVar7[3];
          }
          else {
            local_b8 = *plVar8;
            local_c8 = (long *)*plVar7;
          }
          local_c0 = plVar7[1];
          *plVar7 = (long)plVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_e8.field_2._M_allocated_capacity = *psVar9;
            local_e8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar9;
            local_e8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_e8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if (local_c8 != &local_b8) {
            operator_delete(local_c8);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if (*(char *)(*(long *)(enm + 0x20) + 0x48) == '\0') {
            lVar1 = *(long *)(enm + 8);
            descriptor = internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                                   ((RepeatedPtrFieldBase *)local_f0,(int)lVar13);
            AddError(local_a8,(string *)(lVar1 + 0x20),&descriptor->super_Message,NUMBER,&local_e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < *(int *)(enm + 4));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    std::map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        std::string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] +
            "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, error);
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}